

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TidyConfigParser.cpp
# Opt level: O1

void __thiscall TidyConfigParser::parseCheckConfigs(TidyConfigParser *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  byte bVar2;
  bool bVar3;
  char cVar4;
  byte __c;
  int iVar5;
  undefined7 extraout_var;
  undefined7 extraout_var_00;
  undefined7 extraout_var_01;
  undefined8 extraout_RAX;
  long lVar6;
  _Alloc_hider p;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v11::context>_2 in_R9;
  uint uVar7;
  ulong unaff_R12;
  string_view fmt;
  string_view fmt_00;
  string_view fmt_01;
  string_view fmt_02;
  string_view fmt_03;
  format_args args;
  format_args args_00;
  format_args args_01;
  format_args args_02;
  format_args args_03;
  string optionValue_1;
  string optionValue;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  optionValues;
  string optionName;
  string local_f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_80;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_68;
  string local_50;
  
  paVar1 = &local_d8.field_2;
LAB_001ae4c0:
  uVar7 = (uint)unaff_R12;
  if (((&this->field_0x80)[*(long *)(*(long *)&this->fileStream + -0x18)] & 2) != 0) {
    return;
  }
  while ((iVar5 = std::istream::peek(), iVar5 == 0x20 || (iVar5 = std::istream::peek(), iVar5 == 9))
        ) {
    std::istream::get();
  }
  if ((((&this->field_0x80)[*(long *)(*(long *)&this->fileStream + -0x18)] & 2) == 0) &&
     (cVar4 = std::istream::peek(), cVar4 == '\n')) {
    nextChar(this);
  }
  local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
  local_a0._M_string_length = 0;
  local_a0.field_2._M_local_buf[0] = '\0';
  cVar4 = nextChar(this);
  while (iVar5 = isalpha((int)cVar4), iVar5 != 0) {
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::push_back
              (&local_a0,cVar4);
    cVar4 = nextChar(this);
  }
  if (cVar4 == ':') {
    local_b8.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_b8.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_b8.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    while ((iVar5 = std::istream::peek(), iVar5 == 0x20 ||
           (iVar5 = std::istream::peek(), iVar5 == 9))) {
      std::istream::get();
    }
    if ((((&this->field_0x80)[*(long *)(*(long *)&this->fileStream + -0x18)] & 2) != 0) ||
       (cVar4 = std::istream::peek(), cVar4 != '[')) {
      while ((iVar5 = std::istream::peek(), iVar5 == 0x20 ||
             (iVar5 = std::istream::peek(), iVar5 == 9))) {
        std::istream::get();
      }
      if ((((&this->field_0x80)[*(long *)(*(long *)&this->fileStream + -0x18)] & 2) == 0) &&
         (cVar4 = std::istream::peek(), cVar4 == '\"')) {
        nextChar(this);
        local_f8._M_dataplus._M_p = (pointer)&local_f8.field_2;
        local_f8._M_string_length = 0;
        local_f8.field_2._M_local_buf[0] = '\0';
        do {
          __c = nextChar(this);
          uVar7 = (uint)(char)__c;
          iVar5 = isalnum(uVar7);
          if (iVar5 == 0) {
            bVar2 = 1;
            if (((0x3a < __c - 0x24) ||
                ((0x7800000080004f1U >> ((ulong)(__c - 0x24) & 0x3f) & 1) == 0)) && (2 < __c - 0x7b)
               ) {
              bVar2 = 0;
            }
            if ((bool)(__c != 0x5f & (bVar2 ^ 1))) goto LAB_001ae747;
          }
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::push_back
                    (&local_f8,__c);
        } while( true );
      }
      local_d8._M_string_length = 0;
      local_d8.field_2._M_local_buf[0] = '\0';
      local_d8._M_dataplus._M_p = (pointer)paVar1;
      cVar4 = readIf<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_MikePopoloski[P]slang_tools_tidy_src_TidyConfigParser_cpp:292:34),_true>
                        (this,&local_d8);
      unaff_R12 = CONCAT71(extraout_var_00,cVar4) & 0xffffffff;
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string&>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_b8,
                 &local_d8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d8._M_dataplus._M_p == paVar1) goto LAB_001ae78c;
      lVar6 = CONCAT71(local_d8.field_2._M_allocated_capacity._1_7_,local_d8.field_2._M_local_buf[0]
                      );
      p._M_p = local_d8._M_dataplus._M_p;
      goto LAB_001ae784;
    }
    nextChar(this);
    do {
      local_d8._M_string_length = 0;
      local_d8.field_2._M_local_buf[0] = '\0';
      local_d8._M_dataplus._M_p = (pointer)paVar1;
      cVar4 = readIf<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_MikePopoloski[P]slang_tools_tidy_src_TidyConfigParser_cpp:292:34),_true>
                        (this,&local_d8);
      if (local_d8._M_string_length != 0) {
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::__cxx11::string&>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_b8,
                   &local_d8);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d8._M_dataplus._M_p != paVar1) {
        operator_delete(local_d8._M_dataplus._M_p,
                        CONCAT71(local_d8.field_2._M_allocated_capacity._1_7_,
                                 local_d8.field_2._M_local_buf[0]) + 1);
      }
    } while (cVar4 == ',');
    if (cVar4 != ']') {
      local_d8._M_dataplus._M_p._0_4_ = (int)cVar4;
      fmt.size_ = 0x81;
      fmt.data_ = (char *)0x1d;
      args.field_1.values_ = in_R9.values_;
      args.desc_ = (unsigned_long_long)&local_d8;
      local_d8.field_2._M_local_buf[0] = cVar4;
      ::fmt::v11::vformat_abi_cxx11_(&local_f8,(v11 *)"Expected \']\' but found ({}){}",fmt,args);
      reportErrorAndExit(this,&local_f8);
      goto LAB_001ae8e1;
    }
    cVar4 = nextChar(this);
    unaff_R12 = CONCAT71(extraout_var,cVar4) & 0xffffffff;
    goto LAB_001ae78c;
  }
LAB_001ae8e1:
  local_d8._M_dataplus._M_p._0_4_ = (int)cVar4;
  fmt_00.size_ = 0x81;
  fmt_00.data_ = (char *)0x29;
  args_00.field_1.values_ = in_R9.values_;
  args_00.desc_ = (unsigned_long_long)&local_d8;
  local_d8.field_2._M_local_buf[0] = cVar4;
  ::fmt::v11::vformat_abi_cxx11_
            (&local_f8,(v11 *)"Expected \':\' or a letter but found ({}){}",fmt_00,args_00);
  reportErrorAndExit(this,&local_f8);
  goto LAB_001ae915;
LAB_001ae747:
  if (local_f8._M_string_length != 0) {
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string&>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_b8,
               &local_f8);
  }
  if (__c != 0x22) goto LAB_001ae97d;
  cVar4 = nextChar(this);
  unaff_R12 = CONCAT71(extraout_var_01,cVar4) & 0xffffffff;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
    lVar6 = CONCAT71(local_f8.field_2._M_allocated_capacity._1_7_,local_f8.field_2._M_local_buf[0]);
    p._M_p = local_f8._M_dataplus._M_p;
LAB_001ae784:
    operator_delete(p._M_p,lVar6 + 1);
  }
LAB_001ae78c:
  uVar7 = (uint)unaff_R12;
  if ((char)unaff_R12 != '\0') {
    if ((uVar7 & 0xff) == 0x2c) {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector(&local_68,&local_b8);
      setCheckConfig(this,&local_a0,&local_68);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_68);
      cVar4 = nextChar(this);
      bVar3 = true;
      if (cVar4 == '\n') goto LAB_001ae86c;
    }
    else {
      if ((uVar7 & 0xff) == 10) goto LAB_001ae7a7;
LAB_001ae915:
      local_d8.field_2._M_local_buf[0] = (char)uVar7;
      local_d8._M_dataplus._M_p._0_4_ = (int)local_d8.field_2._M_local_buf[0];
      fmt_01.size_ = 0x81;
      fmt_01.data_ = (char *)0x32;
      args_01.field_1.values_ = in_R9.values_;
      args_01.desc_ = (unsigned_long_long)&local_d8;
      ::fmt::v11::vformat_abi_cxx11_
                (&local_f8,(v11 *)"Expected \',\' new line or a letter but found ({}){}",fmt_01,
                 args_01);
      reportErrorAndExit(this,&local_f8);
    }
    local_d8.field_2._M_local_buf[0] = (char)uVar7;
    local_d8._M_dataplus._M_p._0_4_ = (int)local_d8.field_2._M_local_buf[0];
    fmt_02.size_ = 0x81;
    fmt_02.data_ = (char *)0x23;
    args_02.field_1.values_ = in_R9.values_;
    args_02.desc_ = (unsigned_long_long)&local_d8;
    ::fmt::v11::vformat_abi_cxx11_
              (&local_f8,(v11 *)"Expected new line but found: ({}){}",fmt_02,args_02);
    reportErrorAndExit(this,&local_f8);
LAB_001ae97d:
    local_d8._M_dataplus._M_p._0_4_ = uVar7;
    local_d8.field_2._M_local_buf[0] = (char)uVar7;
    fmt_03.size_ = 0x81;
    fmt_03.data_ = (char *)0x1d;
    args_03.field_1.values_ = in_R9.values_;
    args_03.desc_ = (unsigned_long_long)&local_d8;
    ::fmt::v11::vformat_abi_cxx11_
              (&local_50,(v11 *)"Expected \'\"\' but found ({}){}",fmt_03,args_03);
    reportErrorAndExit(this,&local_50);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
      operator_delete(local_f8._M_dataplus._M_p,
                      CONCAT71(local_f8.field_2._M_allocated_capacity._1_7_,
                               local_f8.field_2._M_local_buf[0]) + 1);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_b8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
      operator_delete(local_a0._M_dataplus._M_p,
                      CONCAT71(local_a0.field_2._M_allocated_capacity._1_7_,
                               local_a0.field_2._M_local_buf[0]) + 1);
    }
    _Unwind_Resume(extraout_RAX);
  }
LAB_001ae7a7:
  while( true ) {
    while ((iVar5 = std::istream::peek(), iVar5 == 0x20 ||
           (iVar5 = std::istream::peek(), iVar5 == 9))) {
      std::istream::get();
    }
    if ((((&this->field_0x80)[*(long *)(*(long *)&this->fileStream + -0x18)] & 2) != 0) ||
       (cVar4 = std::istream::peek(), cVar4 != '\n')) break;
    nextChar(this);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_80,&local_b8);
  setCheckConfig(this,&local_a0,&local_80);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_80);
  this->parserState = Initial;
  bVar3 = false;
LAB_001ae86c:
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_b8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
    operator_delete(local_a0._M_dataplus._M_p,
                    CONCAT71(local_a0.field_2._M_allocated_capacity._1_7_,
                             local_a0.field_2._M_local_buf[0]) + 1);
  }
  if (!bVar3) {
    return;
  }
  goto LAB_001ae4c0;
}

Assistant:

void TidyConfigParser::parseCheckConfigs() {
    while (!fileStream.eof()) {
        // Parse optional newline
        if (peekChar() == '\n')
            nextChar();

        // Parse option name
        std::string optionName;
        char currentChar = readIf(optionName, isalpha);

        if (currentChar != ':') {
            reportErrorAndExit(fmt::format("Expected ':' or a letter but found ({}){}",
                                           +currentChar, currentChar));
        }

        // Parse multiple option values
        std::vector<std::string> optionValues;

        auto isRegexMeta = [](char c) {
            return c == '.' || c == '^' || c == '$' || c == '*' || c == '+' || c == '?' ||
                   c == '{' || c == '}' || c == '[' || c == ']' || c == '\\' || c == '|' ||
                   c == '(' || c == ')';
        };

        auto isOptionValueChar = [](char c) { return isalnum(c) || c == '_'; };
        auto isRegexOptionValueChar = [&](char c) {
            return isalnum(c) || isRegexMeta(c) || c == '_';
        };

        if (peekChar() == '[') {
            currentChar = nextChar(); // skip '['

            do {
                std::string optionValue;
                currentChar = readIf(optionValue, isOptionValueChar);
                if (!optionValue.empty())
                    optionValues.emplace_back(optionValue);
            } while (currentChar == ',');

            if (currentChar != ']') {
                reportErrorAndExit(
                    fmt::format("Expected ']' but found ({}){}", +currentChar, currentChar));
            }
            currentChar = nextChar();
        }
        else if (peekChar() == '"') {
            currentChar = nextChar(); // skip '"'

            std::string optionValue;
            currentChar = readIf(optionValue, isRegexOptionValueChar);
            if (!optionValue.empty())
                optionValues.emplace_back((optionValue));

            if (currentChar != '"') {
                reportErrorAndExit(
                    fmt::format("Expected '\"' but found ({}){}", +currentChar, currentChar));
            }
            currentChar = nextChar();
        }
        else { // Parse single option value
            std::string optionValue;
            currentChar = readIf(optionValue, isOptionValueChar);
            optionValues.emplace_back(optionValue);
        }

        if (currentChar == ',') {
            setCheckConfig(optionName, optionValues);
            if (nextChar() != '\n') {
                reportErrorAndExit(
                    fmt::format("Expected new line but found: ({}){}", +currentChar, currentChar));
            }
        }
        else if (currentChar == '\n' || currentChar == 0) {
            while (peekChar() == '\n')
                nextChar();
            setCheckConfig(optionName, optionValues);
            parserState = ParserState::Initial;
            return;
        }
        else {
            reportErrorAndExit(fmt::format("Expected ',' new line or a letter but found ({}){}",
                                           +currentChar, currentChar));
        }
    }
}